

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_convolve_copy_sse2.c
# Opt level: O2

void highbd_copy_128(uint16_t *src,uint16_t *dst)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  
  uVar1 = *(undefined8 *)(src + 4);
  uVar2 = *(undefined8 *)(src + 8);
  uVar3 = *(undefined8 *)(src + 0xc);
  uVar4 = *(undefined8 *)(src + 0x10);
  uVar5 = *(undefined8 *)(src + 0x14);
  uVar6 = *(undefined8 *)(src + 0x18);
  uVar7 = *(undefined8 *)(src + 0x1c);
  uVar8 = *(undefined8 *)(src + 0x20);
  uVar9 = *(undefined8 *)(src + 0x24);
  uVar10 = *(undefined8 *)(src + 0x28);
  uVar11 = *(undefined8 *)(src + 0x2c);
  uVar12 = *(undefined8 *)(src + 0x30);
  uVar13 = *(undefined8 *)(src + 0x34);
  uVar14 = *(undefined8 *)(src + 0x38);
  uVar15 = *(undefined8 *)(src + 0x3c);
  uVar16 = *(undefined8 *)(src + 0x40);
  uVar17 = *(undefined8 *)(src + 0x44);
  uVar18 = *(undefined8 *)(src + 0x48);
  uVar19 = *(undefined8 *)(src + 0x4c);
  uVar20 = *(undefined8 *)(src + 0x50);
  uVar21 = *(undefined8 *)(src + 0x54);
  uVar22 = *(undefined8 *)(src + 0x58);
  uVar23 = *(undefined8 *)(src + 0x5c);
  uVar24 = *(undefined8 *)(src + 0x60);
  uVar25 = *(undefined8 *)(src + 100);
  uVar26 = *(undefined8 *)(src + 0x68);
  uVar27 = *(undefined8 *)(src + 0x6c);
  uVar28 = *(undefined8 *)(src + 0x70);
  uVar29 = *(undefined8 *)(src + 0x74);
  uVar30 = *(undefined8 *)(src + 0x78);
  uVar31 = *(undefined8 *)(src + 0x7c);
  *(undefined8 *)dst = *(undefined8 *)src;
  *(undefined8 *)(dst + 4) = uVar1;
  *(undefined8 *)(dst + 8) = uVar2;
  *(undefined8 *)(dst + 0xc) = uVar3;
  *(undefined8 *)(dst + 0x10) = uVar4;
  *(undefined8 *)(dst + 0x14) = uVar5;
  *(undefined8 *)(dst + 0x18) = uVar6;
  *(undefined8 *)(dst + 0x1c) = uVar7;
  *(undefined8 *)(dst + 0x20) = uVar8;
  *(undefined8 *)(dst + 0x24) = uVar9;
  *(undefined8 *)(dst + 0x28) = uVar10;
  *(undefined8 *)(dst + 0x2c) = uVar11;
  *(undefined8 *)(dst + 0x30) = uVar12;
  *(undefined8 *)(dst + 0x34) = uVar13;
  *(undefined8 *)(dst + 0x38) = uVar14;
  *(undefined8 *)(dst + 0x3c) = uVar15;
  *(undefined8 *)(dst + 0x40) = uVar16;
  *(undefined8 *)(dst + 0x44) = uVar17;
  *(undefined8 *)(dst + 0x48) = uVar18;
  *(undefined8 *)(dst + 0x4c) = uVar19;
  *(undefined8 *)(dst + 0x50) = uVar20;
  *(undefined8 *)(dst + 0x54) = uVar21;
  *(undefined8 *)(dst + 0x58) = uVar22;
  *(undefined8 *)(dst + 0x5c) = uVar23;
  *(undefined8 *)(dst + 0x60) = uVar24;
  *(undefined8 *)(dst + 100) = uVar25;
  *(undefined8 *)(dst + 0x68) = uVar26;
  *(undefined8 *)(dst + 0x6c) = uVar27;
  *(undefined8 *)(dst + 0x70) = uVar28;
  *(undefined8 *)(dst + 0x74) = uVar29;
  *(undefined8 *)(dst + 0x78) = uVar30;
  *(undefined8 *)(dst + 0x7c) = uVar31;
  return;
}

Assistant:

static inline void highbd_copy_128(const uint16_t *src, uint16_t *dst) {
  __m128i s[16];
  s[0] = _mm_loadu_si128((__m128i *)(src + 0 * 8));
  s[1] = _mm_loadu_si128((__m128i *)(src + 1 * 8));
  s[2] = _mm_loadu_si128((__m128i *)(src + 2 * 8));
  s[3] = _mm_loadu_si128((__m128i *)(src + 3 * 8));
  s[4] = _mm_loadu_si128((__m128i *)(src + 4 * 8));
  s[5] = _mm_loadu_si128((__m128i *)(src + 5 * 8));
  s[6] = _mm_loadu_si128((__m128i *)(src + 6 * 8));
  s[7] = _mm_loadu_si128((__m128i *)(src + 7 * 8));
  s[8] = _mm_loadu_si128((__m128i *)(src + 8 * 8));
  s[9] = _mm_loadu_si128((__m128i *)(src + 9 * 8));
  s[10] = _mm_loadu_si128((__m128i *)(src + 10 * 8));
  s[11] = _mm_loadu_si128((__m128i *)(src + 11 * 8));
  s[12] = _mm_loadu_si128((__m128i *)(src + 12 * 8));
  s[13] = _mm_loadu_si128((__m128i *)(src + 13 * 8));
  s[14] = _mm_loadu_si128((__m128i *)(src + 14 * 8));
  s[15] = _mm_loadu_si128((__m128i *)(src + 15 * 8));
  _mm_store_si128((__m128i *)(dst + 0 * 8), s[0]);
  _mm_store_si128((__m128i *)(dst + 1 * 8), s[1]);
  _mm_store_si128((__m128i *)(dst + 2 * 8), s[2]);
  _mm_store_si128((__m128i *)(dst + 3 * 8), s[3]);
  _mm_store_si128((__m128i *)(dst + 4 * 8), s[4]);
  _mm_store_si128((__m128i *)(dst + 5 * 8), s[5]);
  _mm_store_si128((__m128i *)(dst + 6 * 8), s[6]);
  _mm_store_si128((__m128i *)(dst + 7 * 8), s[7]);
  _mm_store_si128((__m128i *)(dst + 8 * 8), s[8]);
  _mm_store_si128((__m128i *)(dst + 9 * 8), s[9]);
  _mm_store_si128((__m128i *)(dst + 10 * 8), s[10]);
  _mm_store_si128((__m128i *)(dst + 11 * 8), s[11]);
  _mm_store_si128((__m128i *)(dst + 12 * 8), s[12]);
  _mm_store_si128((__m128i *)(dst + 13 * 8), s[13]);
  _mm_store_si128((__m128i *)(dst + 14 * 8), s[14]);
  _mm_store_si128((__m128i *)(dst + 15 * 8), s[15]);
}